

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O0

Alignment * __thiscall
spoa::SisdAlignmentEngine::Convex
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  char cVar1;
  int iVar2;
  value_type pNVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *this_00;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  int *__b;
  pointer pIVar10;
  uint32_t *puVar11;
  reference ppEVar12;
  reference pvVar13;
  size_type sVar14;
  const_reference ppNVar15;
  reference ppEVar16;
  iterator __first;
  iterator __last;
  bool bVar17;
  uint local_394;
  uint32_t local_390;
  uint local_33c;
  uint local_30c;
  bool local_304;
  bool local_302;
  uint local_25c;
  int local_228;
  uint local_224;
  reference ppEStack_220;
  uint32_t pred_i_4;
  Edge **it_4;
  iterator __end6;
  iterator __begin6;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range6;
  uint32_t pred_i_3;
  Edge **it_3;
  iterator __end5;
  iterator __begin5;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range5;
  uint local_1d0;
  int iStack_1cc;
  bool stop;
  uint local_1c8;
  uint32_t local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint32_t p_2;
  uint32_t pred_i_2;
  value_type *it_2;
  uint local_1a8;
  uint32_t p_1;
  uint32_t pred_i_1;
  int32_t match_cost;
  value_type *it_1;
  bool extend_up;
  bool extend_left;
  uint uStack_190;
  bool predecessor_found;
  int32_t H_ij;
  uint32_t prev_j;
  uint32_t prev_i;
  anon_class_16_2_94731f0a ov_condition;
  anon_class_16_2_94731f0a nw_condition;
  anon_class_32_4_301e362c sw_condition;
  uint32_t j;
  uint32_t i;
  AlignmentSubtype local_138;
  int local_134;
  int local_130;
  int local_12c;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_128;
  uint64_t j_3;
  int32_t *Q_row;
  int32_t *E_row;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_f8;
  uint64_t j_2;
  int local_e8;
  uint32_t p;
  int local_e0;
  int local_dc;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_d8;
  uint64_t j_1;
  int32_t *O_pred_row;
  int32_t *O_row;
  int32_t *F_pred_row;
  int32_t *F_row;
  int32_t *H_pred_row;
  int32_t *H_row;
  uint32_t pred_i;
  uint32_t i_1;
  uint32_t *local_90;
  value_type **char_profile;
  Node **it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range1;
  anon_class_24_3_35fc668f update_max_score;
  uint local_48;
  uint32_t max_j;
  uint32_t max_i;
  int32_t max_score;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *rank_to_node;
  uint64_t matrix_width;
  int32_t *score_local;
  Graph *graph_local;
  SisdAlignmentEngine *pSStack_18;
  uint32_t sequence_len_local;
  SisdAlignmentEngine *this_local;
  Alignment *alignment;
  
  rank_to_node = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                 (ulong)(sequence_len + 1);
  matrix_width = (uint64_t)score;
  score_local = (int32_t *)graph;
  graph_local._4_4_ = sequence_len;
  pSStack_18 = this;
  this_local = (SisdAlignmentEngine *)__return_storage_ptr__;
  this_00 = Graph::rank_to_node(graph);
  max_j = 0x80000400;
  if ((this->super_AlignmentEngine).type_ == kSW) {
    max_j = 0;
  }
  local_48 = 0;
  update_max_score.max_j._4_4_ = 0;
  __range1 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)&max_j;
  update_max_score.max_score = (int32_t *)&local_48;
  update_max_score.max_i = (uint32_t *)((long)&update_max_score.max_j + 4);
  _max_i = this_00;
  __end1 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin(this_00);
  it = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end(this_00)
  ;
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                     *)&it), bVar5) {
    char_profile = (value_type **)
                   __gnu_cxx::
                   __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                   ::operator*(&__end1);
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    _pred_i = std::vector<int,_std::allocator<int>_>::operator[]
                        (&pIVar10->sequence_profile,
                         (ulong)(uint)(*char_profile)[1] * (long)rank_to_node);
    local_90 = &pred_i;
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&pIVar10->node_id_to_rank,(ulong)(uint)**char_profile);
    H_row._4_4_ = *pvVar13 + 1;
    bVar5 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                      ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                       (*char_profile + 2));
    if (bVar5) {
      local_25c = 0;
    }
    else {
      pIVar10 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      ppEVar12 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::operator[]
                           ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                            (*char_profile + 2),0);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&pIVar10->node_id_to_rank,(ulong)(*ppEVar12)->tail->id);
      local_25c = *pvVar13 + 1;
    }
    H_row._0_4_ = local_25c;
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    H_pred_row = pIVar10->H + (ulong)H_row._4_4_ * (long)rank_to_node;
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    F_row = pIVar10->H + (ulong)(uint)H_row * (long)rank_to_node;
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    F_pred_row = pIVar10->F + (ulong)H_row._4_4_ * (long)rank_to_node;
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    O_row = pIVar10->F + (ulong)(uint)H_row * (long)rank_to_node;
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    O_pred_row = pIVar10->O + (ulong)H_row._4_4_ * (long)rank_to_node;
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    j_1 = (uint64_t)(pIVar10->O + (ulong)(uint)H_row * (long)rank_to_node);
    for (local_d8 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)0x1;
        local_d8 < rank_to_node;
        local_d8 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                   ((long)&(local_d8->
                           super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
      local_dc = F_row[(long)local_d8] + (int)(this->super_AlignmentEngine).g_;
      local_e0 = O_row[(long)local_d8] + (int)(this->super_AlignmentEngine).e_;
      piVar7 = std::max<int>(&local_dc,&local_e0);
      F_pred_row[(long)local_d8] = *piVar7;
      p = F_row[(long)local_d8] + (int)(this->super_AlignmentEngine).q_;
      local_e8 = *(int *)(j_1 + (long)local_d8 * 4) + (int)(this->super_AlignmentEngine).c_;
      piVar7 = std::max<int>((int *)&p,&local_e8);
      O_pred_row[(long)local_d8] = *piVar7;
      H_pred_row[(long)local_d8] =
           F_row[(long)((long)&local_d8[-1].
                               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)] +
           *(int *)(*(long *)local_90 + (long)local_d8 * 4);
    }
    for (j_2._4_4_ = 1; uVar8 = (ulong)j_2._4_4_,
        sVar14 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::size
                           ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                            (*char_profile + 2)), uVar8 < sVar14; j_2._4_4_ = j_2._4_4_ + 1) {
      pIVar10 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      ppEVar12 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::operator[]
                           ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                            (*char_profile + 2),(ulong)j_2._4_4_);
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&pIVar10->node_id_to_rank,(ulong)(*ppEVar12)->tail->id);
      H_row._0_4_ = *pvVar13 + 1;
      pIVar10 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      F_row = pIVar10->H + (ulong)(uint)H_row * (long)rank_to_node;
      pIVar10 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      O_row = pIVar10->F + (ulong)(uint)H_row * (long)rank_to_node;
      pIVar10 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      j_1 = (uint64_t)(pIVar10->O + (ulong)(uint)H_row * (long)rank_to_node);
      for (local_f8 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)0x1;
          local_f8 < rank_to_node;
          local_f8 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                     ((long)&(local_f8->
                             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1)) {
        piVar7 = F_pred_row + (long)local_f8;
        local_fc = F_row[(long)local_f8] + (int)(this->super_AlignmentEngine).g_;
        local_100 = O_row[(long)local_f8] + (int)(this->super_AlignmentEngine).e_;
        piVar9 = std::max<int>(&local_fc,&local_100);
        piVar7 = std::max<int>(piVar7,piVar9);
        F_pred_row[(long)local_f8] = *piVar7;
        piVar7 = O_pred_row + (long)local_f8;
        local_104 = F_row[(long)local_f8] + (int)(this->super_AlignmentEngine).q_;
        local_108 = *(int *)(j_1 + (long)local_f8 * 4) + (int)(this->super_AlignmentEngine).c_;
        piVar9 = std::max<int>(&local_104,&local_108);
        piVar7 = std::max<int>(piVar7,piVar9);
        O_pred_row[(long)local_f8] = *piVar7;
        E_row._4_4_ = F_row[(long)((long)&local_f8[-1].
                                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)] +
                      *(int *)(*(long *)local_90 + (long)local_f8 * 4);
        piVar7 = std::max<int>(H_pred_row + (long)local_f8,(int *)((long)&E_row + 4));
        H_pred_row[(long)local_f8] = *piVar7;
      }
    }
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    Q_row = pIVar10->E + (ulong)H_row._4_4_ * (long)rank_to_node;
    pIVar10 = std::
              unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
              ::operator->(&this->pimpl_);
    j_3 = (uint64_t)(pIVar10->Q + (ulong)H_row._4_4_ * (long)rank_to_node);
    for (local_128 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)0x1;
        local_128 < rank_to_node;
        local_128 = (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                    ((long)&(local_128->
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1)) {
      local_12c = H_pred_row
                  [(long)((long)&local_128[-1].
                                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)] +
                  (int)(this->super_AlignmentEngine).g_;
      local_130 = Q_row[(long)((long)&local_128[-1].
                                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)] +
                  (int)(this->super_AlignmentEngine).e_;
      piVar7 = std::max<int>(&local_12c,&local_130);
      Q_row[(long)local_128] = *piVar7;
      local_134 = H_pred_row
                  [(long)((long)&local_128[-1].
                                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)] +
                  (int)(this->super_AlignmentEngine).q_;
      local_138 = *(int *)((j_3 - 4) + (long)local_128 * 4) + (int)(this->super_AlignmentEngine).c_;
      piVar7 = std::max<int>(&local_134,(int *)&local_138);
      *(int *)(j_3 + (long)local_128 * 4) = *piVar7;
      piVar7 = H_pred_row + (long)local_128;
      piVar9 = std::max<int>(F_pred_row + (long)local_128,Q_row + (long)local_128);
      __b = std::max<int>(O_pred_row + (long)local_128,(int *)(j_3 + (long)local_128 * 4));
      piVar9 = std::max<int>(piVar9,__b);
      piVar7 = std::max<int>(piVar7,piVar9);
      H_pred_row[(long)local_128] = *piVar7;
      if ((this->super_AlignmentEngine).type_ == kSW) {
        i = 0;
        piVar7 = std::max<int>(H_pred_row + (long)local_128,(int *)&i);
        H_pred_row[(long)local_128] = *piVar7;
        Convex::anon_class_24_3_35fc668f::operator()
                  ((anon_class_24_3_35fc668f *)&__range1,H_pred_row,H_row._4_4_,(uint32_t)local_128)
        ;
      }
      else if ((((this->super_AlignmentEngine).type_ == kNW) &&
               (bVar5 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                        empty((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *)
                              (*char_profile + 8)), bVar5)) &&
              (local_128 ==
               (vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
               ((long)&rank_to_node[-1].
                       super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7U))) {
        Convex::anon_class_24_3_35fc668f::operator()
                  ((anon_class_24_3_35fc668f *)&__range1,H_pred_row,H_row._4_4_,(uint32_t)local_128)
        ;
      }
      else if (((this->super_AlignmentEngine).type_ == kOV) &&
              (bVar5 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                                 ((vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                   *)(*char_profile + 8)), bVar5)) {
        Convex::anon_class_24_3_35fc668f::operator()
                  ((anon_class_24_3_35fc668f *)&__range1,H_pred_row,H_row._4_4_,(uint32_t)local_128)
        ;
      }
    }
    __gnu_cxx::
    __normal_iterator<spoa::Graph::Node_*const_*,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
    ::operator++(&__end1);
  }
  if ((local_48 == 0) && (update_max_score.max_j._4_4_ == 0)) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (__return_storage_ptr__);
  }
  else {
    if (matrix_width != 0) {
      *(uint32_t *)matrix_width = max_j;
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (__return_storage_ptr__);
    sw_condition.matrix_width._4_4_ = local_48;
    sw_condition.matrix_width._0_4_ = update_max_score.max_j._4_4_;
    sw_condition.this = (SisdAlignmentEngine *)((long)&sw_condition.matrix_width + 4);
    sw_condition.i = (uint32_t *)&sw_condition.matrix_width;
    sw_condition.j = (uint32_t *)&rank_to_node;
    ov_condition.j = (uint32_t *)((long)&sw_condition.matrix_width + 4);
    nw_condition.i = (uint32_t *)&sw_condition.matrix_width;
    _prev_j = (uint32_t *)((long)&sw_condition.matrix_width + 4);
    ov_condition.i = (uint32_t *)&sw_condition.matrix_width;
    H_ij = 0;
    uStack_190 = 0;
    nw_condition.j = (uint32_t *)this;
LAB_001444b5:
    if ((this->super_AlignmentEngine).type_ == kSW) {
      bVar5 = Convex::anon_class_32_4_301e362c::operator()
                        ((anon_class_32_4_301e362c *)&nw_condition.j);
      local_302 = true;
      if (!bVar5) goto LAB_001444eb;
    }
    else {
LAB_001444eb:
      if ((this->super_AlignmentEngine).type_ == kNW) {
        bVar5 = Convex::anon_class_16_2_94731f0a::operator()
                          ((anon_class_16_2_94731f0a *)&ov_condition.j);
        local_302 = true;
        if (bVar5) goto LAB_00144564;
      }
      local_304 = false;
      if ((this->super_AlignmentEngine).type_ == kOV) {
        local_304 = Convex::anon_class_16_2_94731f0a::operator()
                              ((anon_class_16_2_94731f0a *)&prev_j);
      }
      local_302 = local_304;
    }
LAB_00144564:
    if (local_302 != false) {
      pIVar10 = std::
                unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                ::operator->(&this->pimpl_);
      it_1._4_4_ = pIVar10->H
                   [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                    (ulong)(uint)sw_condition.matrix_width];
      it_1._3_1_ = 0;
      it_1._2_1_ = 0;
      it_1._1_1_ = 0;
      if ((sw_condition.matrix_width._4_4_ != 0) && ((uint)sw_condition.matrix_width != 0)) {
        _pred_i_1 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                    operator[](_max_i,(ulong)(sw_condition.matrix_width._4_4_ - 1));
        pIVar10 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        puVar11 = (uint32_t *)
                  std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar10->sequence_profile,
                             (ulong)(*_pred_i_1)->code * (long)rank_to_node +
                             (ulong)(uint)sw_condition.matrix_width);
        p_1 = *puVar11;
        bVar5 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                          (&(*_pred_i_1)->inedges);
        if (bVar5) {
          local_30c = 0;
        }
        else {
          pIVar10 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          ppEVar12 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                     operator[](&(*_pred_i_1)->inedges,0);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&pIVar10->node_id_to_rank,(ulong)(*ppEVar12)->tail->id);
          local_30c = *pvVar13 + 1;
        }
        iVar2 = it_1._4_4_;
        local_1a8 = local_30c;
        pIVar10 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        if (iVar2 == pIVar10->H
                     [(ulong)local_1a8 * (long)rank_to_node +
                      (ulong)((uint)sw_condition.matrix_width - 1)] + p_1) {
          H_ij = local_1a8;
          uStack_190 = (uint)sw_condition.matrix_width - 1;
          it_1._3_1_ = 1;
        }
        else {
          for (it_2._4_4_ = 1; uVar8 = (ulong)it_2._4_4_,
              sVar14 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::size
                                 (&(*_pred_i_1)->inedges), uVar8 < sVar14;
              it_2._4_4_ = it_2._4_4_ + 1) {
            pIVar10 = std::
                      unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                      ::operator->(&this->pimpl_);
            ppEVar12 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                       operator[](&(*_pred_i_1)->inedges,(ulong)it_2._4_4_);
            pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&pIVar10->node_id_to_rank,(ulong)(*ppEVar12)->tail->id);
            iVar2 = it_1._4_4_;
            local_1a8 = *pvVar13 + 1;
            pIVar10 = std::
                      unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                      ::operator->(&this->pimpl_);
            if (iVar2 == pIVar10->H
                         [(ulong)local_1a8 * (long)rank_to_node +
                          (ulong)((uint)sw_condition.matrix_width - 1)] + p_1) {
              H_ij = local_1a8;
              uStack_190 = (uint)sw_condition.matrix_width - 1;
              it_1._3_1_ = 1;
              break;
            }
          }
        }
      }
      if (((it_1._3_1_ & 1) == 0) && (sw_condition.matrix_width._4_4_ != 0)) {
        _p_2 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                         (_max_i,(ulong)(sw_condition.matrix_width._4_4_ - 1));
        bVar5 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                          (&(*_p_2)->inedges);
        if (bVar5) {
          local_33c = 0;
        }
        else {
          pIVar10 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          ppEVar12 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                     operator[](&(*_p_2)->inedges,0);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&pIVar10->node_id_to_rank,(ulong)(*ppEVar12)->tail->id);
          local_33c = *pvVar13 + 1;
        }
        iVar2 = it_1._4_4_;
        local_1bc = local_33c;
        pIVar10 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        iVar4 = it_1._4_4_;
        bVar17 = iVar2 == pIVar10->F
                          [(ulong)local_1bc * (long)rank_to_node +
                           (ulong)(uint)sw_condition.matrix_width] +
                          (int)(this->super_AlignmentEngine).e_;
        bVar5 = (it_1._1_1_ & 1) != 0;
        it_1._1_1_ = bVar5 || bVar17;
        if ((!bVar5 && !bVar17) &&
           (pIVar10 = std::
                      unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                      ::operator->(&this->pimpl_), iVar2 = it_1._4_4_,
           iVar4 != pIVar10->H
                    [(ulong)local_1bc * (long)rank_to_node + (ulong)(uint)sw_condition.matrix_width]
                    + (int)(this->super_AlignmentEngine).g_)) {
          pIVar10 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          iVar4 = it_1._4_4_;
          bVar17 = iVar2 == pIVar10->O
                            [(ulong)local_1bc * (long)rank_to_node +
                             (ulong)(uint)sw_condition.matrix_width] +
                            (int)(this->super_AlignmentEngine).c_;
          bVar5 = (it_1._1_1_ & 1) != 0;
          it_1._1_1_ = bVar5 || bVar17;
          if ((!bVar5 && !bVar17) &&
             (pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_),
             iVar4 != pIVar10->H
                      [(ulong)local_1bc * (long)rank_to_node +
                       (ulong)(uint)sw_condition.matrix_width] +
                      (int)(this->super_AlignmentEngine).q_)) {
            for (local_1c0 = 1; uVar8 = (ulong)local_1c0,
                sVar14 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                         size(&(*_p_2)->inedges), uVar8 < sVar14; local_1c0 = local_1c0 + 1) {
              pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_);
              ppEVar12 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                         operator[](&(*_p_2)->inedges,(ulong)local_1c0);
              pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (&pIVar10->node_id_to_rank,(ulong)(*ppEVar12)->tail->id);
              iVar2 = it_1._4_4_;
              local_1bc = *pvVar13 + 1;
              pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_);
              iVar4 = it_1._4_4_;
              it_1._1_1_ = (it_1._1_1_ & 1) != 0 ||
                           iVar2 == pIVar10->F
                                    [(ulong)local_1bc * (long)rank_to_node +
                                     (ulong)(uint)sw_condition.matrix_width] +
                                    (int)(this->super_AlignmentEngine).e_;
              if (((bool)it_1._1_1_) ||
                 (pIVar10 = std::
                            unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                            ::operator->(&this->pimpl_), iVar2 = it_1._4_4_,
                 iVar4 == pIVar10->H
                          [(ulong)local_1bc * (long)rank_to_node +
                           (ulong)(uint)sw_condition.matrix_width] +
                          (int)(this->super_AlignmentEngine).g_)) {
LAB_00144ce3:
                H_ij = local_1bc;
                uStack_190 = (uint)sw_condition.matrix_width;
                it_1._3_1_ = 1;
                break;
              }
              pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_);
              iVar4 = it_1._4_4_;
              it_1._1_1_ = (it_1._1_1_ & 1) != 0 ||
                           iVar2 == pIVar10->O
                                    [(ulong)local_1bc * (long)rank_to_node +
                                     (ulong)(uint)sw_condition.matrix_width] +
                                    (int)(this->super_AlignmentEngine).c_;
              if (((bool)it_1._1_1_) ||
                 (pIVar10 = std::
                            unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                            ::operator->(&this->pimpl_),
                 iVar4 == pIVar10->H
                          [(ulong)local_1bc * (long)rank_to_node +
                           (ulong)(uint)sw_condition.matrix_width] +
                          (int)(this->super_AlignmentEngine).q_)) goto LAB_00144ce3;
            }
            goto LAB_00144d1e;
          }
        }
        H_ij = local_1bc;
        uStack_190 = (uint)sw_condition.matrix_width;
        it_1._3_1_ = 1;
      }
LAB_00144d1e:
      iVar2 = it_1._4_4_;
      if (((it_1._3_1_ & 1) == 0) && ((uint)sw_condition.matrix_width != 0)) {
        pIVar10 = std::
                  unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                  ::operator->(&this->pimpl_);
        iVar4 = it_1._4_4_;
        bVar17 = iVar2 == pIVar10->E
                          [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                           (ulong)(uint)sw_condition.matrix_width + -1] +
                          (int)(this->super_AlignmentEngine).e_;
        bVar5 = (it_1._2_1_ & 1) != 0;
        it_1._2_1_ = bVar5 || bVar17;
        if ((!bVar5 && !bVar17) &&
           (pIVar10 = std::
                      unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                      ::operator->(&this->pimpl_), iVar2 = it_1._4_4_,
           iVar4 != pIVar10->H
                    [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                     (ulong)(uint)sw_condition.matrix_width + -1] +
                    (int)(this->super_AlignmentEngine).g_)) {
          pIVar10 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          iVar4 = it_1._4_4_;
          bVar17 = iVar2 == pIVar10->Q
                            [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                             (ulong)(uint)sw_condition.matrix_width + -1] +
                            (int)(this->super_AlignmentEngine).c_;
          bVar5 = (it_1._2_1_ & 1) != 0;
          it_1._2_1_ = bVar5 || bVar17;
          if ((!bVar5 && !bVar17) &&
             (pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_),
             iVar4 != pIVar10->H
                      [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                       (ulong)(uint)sw_condition.matrix_width + -1] +
                      (int)(this->super_AlignmentEngine).q_)) goto LAB_00144f08;
        }
        H_ij = sw_condition.matrix_width._4_4_;
        uStack_190 = (uint)sw_condition.matrix_width - 1;
        it_1._3_1_ = 1;
      }
LAB_00144f08:
      if (sw_condition.matrix_width._4_4_ == H_ij) {
        local_390 = 0xffffffff;
      }
      else {
        ppNVar15 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                   operator[](_max_i,(ulong)(sw_condition.matrix_width._4_4_ - 1));
        local_390 = (*ppNVar15)->id;
      }
      local_1c4 = local_390;
      if ((uint)sw_condition.matrix_width == uStack_190) {
        local_394 = 0xffffffff;
      }
      else {
        local_394 = (uint)sw_condition.matrix_width - 1;
      }
      local_1c8 = local_394;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<unsigned_int,unsigned_int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 __return_storage_ptr__,&local_1c4,&local_1c8);
      sw_condition.matrix_width._4_4_ = H_ij;
      sw_condition.matrix_width._0_4_ = uStack_190;
      if ((it_1._2_1_ & 1) == 0) {
        if ((it_1._1_1_ & 1) != 0) {
          do {
            bVar5 = true;
            H_ij = 0;
            ppNVar15 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                       operator[](_max_i,(ulong)(sw_condition.matrix_width._4_4_ - 1));
            pNVar3 = *ppNVar15;
            __end5 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                               (&pNVar3->inedges);
            it_3 = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::
                            end(&pNVar3->inedges);
            while (bVar17 = __gnu_cxx::operator!=
                                      (&__end5,(__normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                                *)&it_3), bVar17) {
              ppEVar16 = __gnu_cxx::
                         __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                         ::operator*(&__end5);
              pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_);
              pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (&pIVar10->node_id_to_rank,(ulong)(*ppEVar16)->tail->id);
              uVar6 = *pvVar13 + 1;
              pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_);
              iVar2 = pIVar10->F
                      [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                       (ulong)(uint)sw_condition.matrix_width];
              pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_);
              if (iVar2 == pIVar10->F
                           [(ulong)uVar6 * (long)rank_to_node +
                            (ulong)(uint)sw_condition.matrix_width] +
                           (int)(this->super_AlignmentEngine).e_) {
LAB_001452b1:
                bVar5 = false;
                H_ij = uVar6;
                break;
              }
              pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_);
              iVar2 = pIVar10->O
                      [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                       (ulong)(uint)sw_condition.matrix_width];
              pIVar10 = std::
                        unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                        ::operator->(&this->pimpl_);
              if (iVar2 == pIVar10->O
                           [(ulong)uVar6 * (long)rank_to_node +
                            (ulong)(uint)sw_condition.matrix_width] +
                           (int)(this->super_AlignmentEngine).c_) goto LAB_001452b1;
              __gnu_cxx::
              __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
              ::operator++(&__end5);
            }
            if (bVar5) {
              ppNVar15 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                         operator[](_max_i,(ulong)(sw_condition.matrix_width._4_4_ - 1));
              pNVar3 = *ppNVar15;
              __end6 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                                 (&pNVar3->inedges);
              it_4 = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ::end(&pNVar3->inedges);
              while (bVar17 = __gnu_cxx::operator!=
                                        (&__end6,(__normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                                  *)&it_4), bVar17) {
                ppEStack_220 = __gnu_cxx::
                               __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                               ::operator*(&__end6);
                pIVar10 = std::
                          unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                          ::operator->(&this->pimpl_);
                pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (&pIVar10->node_id_to_rank,(ulong)(*ppEStack_220)->tail->id);
                local_224 = *pvVar13 + 1;
                pIVar10 = std::
                          unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                          ::operator->(&this->pimpl_);
                iVar2 = pIVar10->F
                        [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                         (ulong)(uint)sw_condition.matrix_width];
                pIVar10 = std::
                          unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                          ::operator->(&this->pimpl_);
                if (iVar2 == pIVar10->H
                             [(ulong)local_224 * (long)rank_to_node +
                              (ulong)(uint)sw_condition.matrix_width] +
                             (int)(this->super_AlignmentEngine).g_) {
LAB_00145486:
                  H_ij = local_224;
                  break;
                }
                pIVar10 = std::
                          unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                          ::operator->(&this->pimpl_);
                iVar2 = pIVar10->O
                        [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                         (ulong)(uint)sw_condition.matrix_width];
                pIVar10 = std::
                          unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                          ::operator->(&this->pimpl_);
                if (iVar2 == pIVar10->H
                             [(ulong)local_224 * (long)rank_to_node +
                              (ulong)(uint)sw_condition.matrix_width] +
                             (int)(this->super_AlignmentEngine).q_) goto LAB_00145486;
                __gnu_cxx::
                __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                ::operator++(&__end6);
              }
            }
            ppNVar15 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                       operator[](_max_i,(ulong)(sw_condition.matrix_width._4_4_ - 1));
            local_228 = -1;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<unsigned_int&,int>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                       __return_storage_ptr__,&(*ppNVar15)->id,&local_228);
            sw_condition.matrix_width._4_4_ = H_ij;
          } while ((!bVar5) && (H_ij != 0));
        }
      }
      else {
        do {
          do {
            iStack_1cc = -1;
            local_1d0 = (uint)sw_condition.matrix_width - 1;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<int,unsigned_int>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                       __return_storage_ptr__,&stack0xfffffffffffffe34,&local_1d0);
            sw_condition.matrix_width._0_4_ = (uint)sw_condition.matrix_width - 1;
            pIVar10 = std::
                      unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                      ::operator->(&this->pimpl_);
            iVar2 = pIVar10->E
                    [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                     (ulong)(uint)sw_condition.matrix_width];
            cVar1 = (this->super_AlignmentEngine).e_;
            pIVar10 = std::
                      unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                      ::operator->(&this->pimpl_);
          } while (iVar2 + cVar1 ==
                   pIVar10->E
                   [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                    (ulong)(uint)sw_condition.matrix_width + 1]);
          pIVar10 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
          iVar2 = pIVar10->Q
                  [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                   (ulong)(uint)sw_condition.matrix_width];
          cVar1 = (this->super_AlignmentEngine).c_;
          pIVar10 = std::
                    unique_ptr<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ::operator->(&this->pimpl_);
        } while (iVar2 + cVar1 ==
                 pIVar10->Q
                 [(ulong)sw_condition.matrix_width._4_4_ * (long)rank_to_node +
                  (ulong)(uint)sw_condition.matrix_width + 1]);
      }
      goto LAB_001444b5;
    }
    __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                        (__return_storage_ptr__);
    __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                       (__return_storage_ptr__);
    std::
    reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )__last._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

Alignment SisdAlignmentEngine::Convex(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    std::int32_t* F_row = &(pimpl_->F[i * matrix_width]);
    std::int32_t* F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

    std::int32_t* O_row = &(pimpl_->O[i * matrix_width]);
    std::int32_t* O_pred_row = &(pimpl_->O[pred_i * matrix_width]);

    // update F, O and H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      F_row[j] = std::max(H_pred_row[j] + g_, F_pred_row[j] + e_);
      O_row[j] = std::max(H_pred_row[j] + q_, O_pred_row[j] + c_);
      H_row[j] = H_pred_row[j - 1] + char_profile[j];
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);
      F_pred_row = &(pimpl_->F[pred_i * matrix_width]);
      O_pred_row = &(pimpl_->O[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        F_row[j] = std::max(
            F_row[j],
            std::max(
                H_pred_row[j] + g_,
                F_pred_row[j] + e_));
        O_row[j] = std::max(
            O_row[j],
            std::max(
                H_pred_row[j] + q_,
                O_pred_row[j] + c_));
        H_row[j] = std::max(H_row[j], H_pred_row[j - 1] + char_profile[j]);
      }
    }

    // update E, Q and H
    std::int32_t* E_row = &(pimpl_->E[i * matrix_width]);
    std::int32_t* Q_row = &(pimpl_->Q[i * matrix_width]);
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      E_row[j] = std::max(H_row[j - 1] + g_, E_row[j - 1] + e_);
      Q_row[j] = std::max(H_row[j - 1] + q_, Q_row[j - 1] + c_);
      H_row[j] = std::max(
        H_row[j],
        std::max(
            std::max(F_row[j], E_row[j]),
            std::max(O_row[j], Q_row[j])));

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          (it->outedges.empty() && j == matrix_width - 1)) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && it->outedges.empty()) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;

  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false, extend_left = false, extend_up = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
        pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if ((extend_up |= H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                        H_ij == pimpl_->H[pred_i * matrix_width + j] + g_  ||
          (extend_up |= H_ij == pimpl_->O[pred_i * matrix_width + j] + c_) ||
                        H_ij == pimpl_->H[pred_i * matrix_width + j] + q_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if ((extend_up |= H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||  // NOLINT
                            H_ij == pimpl_->H[pred_i * matrix_width + j] + g_  ||  // NOLINT
              (extend_up |= H_ij == pimpl_->O[pred_i * matrix_width + j] + c_) ||  // NOLINT
                            H_ij == pimpl_->H[pred_i * matrix_width + j] + q_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && j != 0) {
      if ((extend_left |= H_ij == pimpl_->E[i * matrix_width + j - 1] + e_) ||
                          H_ij == pimpl_->H[i * matrix_width + j - 1] + g_  ||
          (extend_left |= H_ij == pimpl_->Q[i * matrix_width + j - 1] + c_) ||
                          H_ij == pimpl_->H[i * matrix_width + j - 1] + q_) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;

    if (extend_left) {
      while (true) {
        alignment.emplace_back(-1, j - 1);
        --j;
        if (pimpl_->E[i * matrix_width + j] + e_ != pimpl_->E[i * matrix_width + j + 1] &&  // NOLINT
            pimpl_->Q[i * matrix_width + j] + c_ != pimpl_->Q[i * matrix_width + j + 1]) {  // NOLINT
          break;
        }
      }
    } else if (extend_up) {
      while (true) {
        bool stop = true;
        prev_i = 0;
        for (const auto& it : rank_to_node[i - 1]->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

          if (pimpl_->F[i * matrix_width + j] == pimpl_->F[pred_i * matrix_width + j] + e_ ||  // NOLINT
              pimpl_->O[i * matrix_width + j] == pimpl_->O[pred_i * matrix_width + j] + c_) {  // NOLINT
            prev_i = pred_i;
            stop = false;
            break;
          }
        }
        if (stop == true) {
          for (const auto& it : rank_to_node[i - 1]->inedges) {
            std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

            if (pimpl_->F[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + g_ ||  // NOLINT
                pimpl_->O[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + q_) {  // NOLINT
              prev_i = pred_i;
              break;
            }
          }
        }

        alignment.emplace_back(rank_to_node[i - 1]->id, -1);
        i = prev_i;

        if (stop || i == 0) {
          break;
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}